

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O3

void __thiscall
polyscope::render::backend_openGL3_glfw::GLShaderProgram::assignBufferToVAO
          (GLShaderProgram *this,GLShaderAttribute *a)

{
  invalid_argument *this_00;
  GLenum GVar1;
  int iVar2;
  long lVar3;
  GLint GVar4;
  GLuint GVar5;
  AttributeLocation AVar6;
  int iVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  
  (*glad_glBindVertexArray)(this->vaoHandle);
  (*glad_glBindBuffer)
            (0x8892,((a->buff).
                     super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLAttributeBuffer,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->VBOLoc);
  checkGLError(true);
  if (0 < a->arrayCount) {
    pvVar11 = (void *)0x0;
    pvVar12 = (void *)0x0;
    pvVar9 = (void *)0x0;
    pvVar10 = (void *)0x0;
    lVar3 = 0;
    do {
      iVar2 = (int)lVar3;
      (*glad_glEnableVertexAttribArray)(a->location + iVar2);
      switch(a->type) {
      case Vector2Float:
        AVar6 = a->location;
        iVar7 = a->arrayCount;
        GVar1 = 0x1406;
        goto LAB_002826ed;
      case Vector3Float:
        iVar7 = a->arrayCount;
        AVar6 = a->location;
        GVar1 = 0x1406;
        goto LAB_002826cc;
      case Vector4Float:
        AVar6 = a->location;
        iVar7 = a->arrayCount;
        GVar1 = 0x1406;
        goto LAB_0028267f;
      default:
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this_00,"Unrecognized GLShaderAttribute type");
        __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      case Float:
        AVar6 = a->location;
        iVar7 = a->arrayCount;
        GVar1 = 0x1406;
        break;
      case Int:
        AVar6 = a->location;
        iVar7 = a->arrayCount;
        GVar1 = 0x1404;
        break;
      case UInt:
        AVar6 = a->location;
        iVar7 = a->arrayCount;
        GVar1 = 0x1405;
        break;
      case Vector2UInt:
        AVar6 = a->location;
        iVar7 = a->arrayCount;
        GVar1 = 0x1405;
LAB_002826ed:
        GVar4 = 2;
        GVar5 = AVar6 + iVar2;
        iVar7 = iVar7 << 3;
        pvVar8 = pvVar12;
        goto LAB_002826f8;
      case Vector3UInt:
        iVar7 = a->arrayCount;
        AVar6 = a->location;
        GVar1 = 0x1405;
LAB_002826cc:
        GVar4 = 3;
        GVar5 = AVar6 + iVar2;
        iVar7 = iVar7 * 0xc;
        pvVar8 = pvVar9;
        goto LAB_002826f8;
      case Vector4UInt:
        AVar6 = a->location;
        iVar7 = a->arrayCount;
        GVar1 = 0x1405;
LAB_0028267f:
        GVar4 = 4;
        GVar5 = AVar6 + iVar2;
        iVar7 = iVar7 << 4;
        pvVar8 = pvVar10;
        goto LAB_002826f8;
      }
      GVar4 = 1;
      GVar5 = AVar6 + iVar2;
      iVar7 = iVar7 << 2;
      pvVar8 = pvVar11;
LAB_002826f8:
      (*glad_glVertexAttribPointer)(GVar5,GVar4,GVar1,'\0',iVar7,pvVar8);
      lVar3 = lVar3 + 1;
      pvVar10 = (void *)((long)pvVar10 + 0x10);
      pvVar9 = (void *)((long)pvVar9 + 0xc);
      pvVar12 = (void *)((long)pvVar12 + 8);
      pvVar11 = (void *)((long)pvVar11 + 4);
    } while (lVar3 < a->arrayCount);
  }
  checkGLError(true);
  return;
}

Assistant:

void GLShaderProgram::assignBufferToVAO(GLShaderAttribute& a) {
  bindVAO();
  a.buff->bind();
  checkGLError();

  // Choose the correct type for the buffer
  for (int iArrInd = 0; iArrInd < a.arrayCount; iArrInd++) {

    glEnableVertexAttribArray(a.location + iArrInd);

    switch (a.type) {
    case RenderDataType::Float:
      glVertexAttribPointer(a.location + iArrInd, 1, GL_FLOAT, GL_FALSE, sizeof(float) * 1 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(float) * 1 * iArrInd));
      break;
    case RenderDataType::Int:
      glVertexAttribPointer(a.location + iArrInd, 1, GL_INT, GL_FALSE, sizeof(int) * 1 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(int) * 1 * iArrInd));
      break;
    case RenderDataType::UInt:
      glVertexAttribPointer(a.location + iArrInd, 1, GL_UNSIGNED_INT, GL_FALSE, sizeof(uint32_t) * 1 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(uint32_t) * 1 * iArrInd));
      break;
    case RenderDataType::Vector2Float:
      glVertexAttribPointer(a.location + iArrInd, 2, GL_FLOAT, GL_FALSE, sizeof(float) * 2 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(float) * 2 * iArrInd));
      break;
    case RenderDataType::Vector3Float:
      glVertexAttribPointer(a.location + iArrInd, 3, GL_FLOAT, GL_FALSE, sizeof(float) * 3 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(float) * 3 * iArrInd));
      break;
    case RenderDataType::Vector4Float:
      glVertexAttribPointer(a.location + iArrInd, 4, GL_FLOAT, GL_FALSE, sizeof(float) * 4 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(float) * 4 * iArrInd));
      break;
    case RenderDataType::Vector2UInt:
      glVertexAttribPointer(a.location + iArrInd, 2, GL_UNSIGNED_INT, GL_FALSE, sizeof(uint32_t) * 2 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(uint32_t) * 2 * iArrInd));
      break;
    case RenderDataType::Vector3UInt:
      glVertexAttribPointer(a.location + iArrInd, 3, GL_UNSIGNED_INT, GL_FALSE, sizeof(uint32_t) * 3 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(uint32_t) * 3 * iArrInd));
      break;
    case RenderDataType::Vector4UInt:
      glVertexAttribPointer(a.location + iArrInd, 4, GL_UNSIGNED_INT, GL_FALSE, sizeof(uint32_t) * 4 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(uint32_t) * 4 * iArrInd));
      break;
    default:
      throw std::invalid_argument("Unrecognized GLShaderAttribute type");
      break;
    }
  }

  checkGLError();
}